

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ds_stack.c
# Opt level: O1

void test_dsStack_counts(void)

{
  int iVar1;
  
  iVar1 = ds_stack_counts(stack);
  UnityAssertEqualNumber((long)iVar1,0,"unexpected counts!",0x19,UNITY_DISPLAY_STYLE_INT);
  ds_stack_push(stack,"aa");
  iVar1 = ds_stack_counts(stack);
  UnityAssertEqualNumber((long)iVar1,1,"unexpected counts!",0x1b,UNITY_DISPLAY_STYLE_INT);
  ds_stack_push(stack,"bb");
  iVar1 = ds_stack_counts(stack);
  UnityAssertEqualNumber((long)iVar1,2,"unexpected counts!",0x1d,UNITY_DISPLAY_STYLE_INT);
  ds_stack_push(stack,"cc");
  iVar1 = ds_stack_counts(stack);
  UnityAssertEqualNumber((long)iVar1,3,"unexpected counts!",0x1f,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_dsStack_counts()
{
    TEST_ASSERT_EQUAL_MESSAGE(ds_stack_counts(stack), 0, "unexpected counts!");
    ds_stack_push(stack, "aa");
    TEST_ASSERT_EQUAL_MESSAGE(ds_stack_counts(stack), 1, "unexpected counts!");
    ds_stack_push(stack, "bb");
    TEST_ASSERT_EQUAL_MESSAGE(ds_stack_counts(stack), 2, "unexpected counts!");
    ds_stack_push(stack, "cc");
    TEST_ASSERT_EQUAL_MESSAGE(ds_stack_counts(stack), 3, "unexpected counts!");
}